

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  _func_int **pp_Var22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  int mask;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2520) [16];
  undefined4 local_250c;
  ulong local_2508;
  RayHit *local_2500;
  RayQueryContext *local_24f8;
  long local_24f0;
  long local_24e8;
  RTCIntersectFunctionNArguments local_24e0;
  Geometry *local_24b0;
  undefined8 local_24a8;
  RTCIntersectArguments *local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2520 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar35 = ZEXT816(0) << 0x40;
    auVar41 = ZEXT1664(auVar35);
    auVar31 = vmaxss_avx(auVar35,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar34 = ZEXT464((uint)fVar3);
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx((undefined1  [16])aVar5,auVar37);
    auVar47._8_4_ = 0x219392ef;
    auVar47._0_8_ = 0x219392ef219392ef;
    auVar47._12_4_ = 0x219392ef;
    auVar37 = vcmpps_avx(auVar37,auVar47,1);
    auVar37 = vblendvps_avx((undefined1  [16])aVar5,auVar47,auVar37);
    auVar35 = vmaxss_avx(auVar35,ZEXT416((uint)fVar3));
    auVar47 = vrcpps_avx(auVar37);
    fVar3 = auVar47._0_4_;
    auVar42._0_4_ = auVar37._0_4_ * fVar3;
    fVar10 = auVar47._4_4_;
    auVar42._4_4_ = auVar37._4_4_ * fVar10;
    fVar11 = auVar47._8_4_;
    auVar42._8_4_ = auVar37._8_4_ * fVar11;
    fVar12 = auVar47._12_4_;
    auVar42._12_4_ = auVar37._12_4_ * fVar12;
    auVar51._8_4_ = 0x3f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar51._12_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar51,auVar42);
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar4;
    local_23c0._0_4_ = uVar4;
    local_23c0._8_4_ = uVar4;
    local_23c0._12_4_ = uVar4;
    local_23c0._16_4_ = uVar4;
    local_23c0._20_4_ = uVar4;
    local_23c0._24_4_ = uVar4;
    local_23c0._28_4_ = uVar4;
    auVar52 = ZEXT3264(local_23c0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar4;
    local_23e0._0_4_ = uVar4;
    local_23e0._8_4_ = uVar4;
    local_23e0._12_4_ = uVar4;
    local_23e0._16_4_ = uVar4;
    local_23e0._20_4_ = uVar4;
    local_23e0._24_4_ = uVar4;
    local_23e0._28_4_ = uVar4;
    auVar53 = ZEXT3264(local_23e0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar4;
    local_2400._0_4_ = uVar4;
    local_2400._8_4_ = uVar4;
    local_2400._12_4_ = uVar4;
    local_2400._16_4_ = uVar4;
    local_2400._20_4_ = uVar4;
    local_2400._24_4_ = uVar4;
    local_2400._28_4_ = uVar4;
    auVar54 = ZEXT3264(local_2400);
    auVar43._0_4_ = fVar3 + fVar3 * auVar37._0_4_;
    auVar43._4_4_ = fVar10 + fVar10 * auVar37._4_4_;
    auVar43._8_4_ = fVar11 + fVar11 * auVar37._8_4_;
    auVar43._12_4_ = fVar12 + fVar12 * auVar37._12_4_;
    auVar37 = vshufps_avx(auVar43,auVar43,0);
    local_2420._16_16_ = auVar37;
    local_2420._0_16_ = auVar37;
    auVar55 = ZEXT3264(local_2420);
    auVar37 = vmovshdup_avx(auVar43);
    auVar50 = ZEXT1664(auVar37);
    auVar47 = vshufps_avx(auVar43,auVar43,0x55);
    local_2440._16_16_ = auVar47;
    local_2440._0_16_ = auVar47;
    auVar56 = ZEXT3264(local_2440);
    auVar47 = vshufpd_avx(auVar43,auVar43,1);
    auVar42 = vshufps_avx(auVar43,auVar43,0xaa);
    auVar46 = ZEXT1664(auVar42);
    uVar27 = (ulong)(auVar43._0_4_ < 0.0) << 5;
    local_2460._16_16_ = auVar42;
    local_2460._0_16_ = auVar42;
    auVar57 = ZEXT3264(local_2460);
    uVar26 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x40;
    uVar29 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x80;
    uVar28 = uVar27 ^ 0x20;
    auVar37 = vshufps_avx(auVar31,auVar31,0);
    local_2480._16_16_ = auVar37;
    local_2480._0_16_ = auVar37;
    auVar58 = ZEXT3264(local_2480);
    auVar37 = vshufps_avx(auVar35,auVar35,0);
    auVar30 = ZEXT3264(CONCAT1616(auVar37,auVar37));
    local_2508 = uVar27;
    local_2500 = ray;
    local_24f8 = context;
LAB_00e7a06e:
    if (local_2520 != (undefined1 (*) [16])&local_23a0) {
      pauVar21 = local_2520 + -1;
      local_2520 = local_2520 + -1;
      if (*(float *)(*pauVar21 + 8) <= auVar34._0_4_) {
        uVar25 = *(ulong *)*local_2520;
        while ((uVar25 & 8) == 0) {
          uVar19 = uVar25 & 0xfffffffffffffff0;
          fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar36._4_4_ = fVar3;
          auVar36._0_4_ = fVar3;
          auVar36._8_4_ = fVar3;
          auVar36._12_4_ = fVar3;
          auVar36._16_4_ = fVar3;
          auVar36._20_4_ = fVar3;
          auVar36._24_4_ = fVar3;
          auVar36._28_4_ = fVar3;
          pfVar2 = (float *)(uVar19 + 0x100 + uVar27);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar27);
          auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar33._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar33._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar33._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar33._28_4_ = auVar34._28_4_ + pfVar1[7];
          auVar33 = vsubps_avx(auVar33,auVar52._0_32_);
          auVar13._4_4_ = auVar55._4_4_ * auVar33._4_4_;
          auVar13._0_4_ = auVar55._0_4_ * auVar33._0_4_;
          auVar13._8_4_ = auVar55._8_4_ * auVar33._8_4_;
          auVar13._12_4_ = auVar55._12_4_ * auVar33._12_4_;
          auVar13._16_4_ = auVar55._16_4_ * auVar33._16_4_;
          auVar13._20_4_ = auVar55._20_4_ * auVar33._20_4_;
          auVar13._24_4_ = auVar55._24_4_ * auVar33._24_4_;
          auVar13._28_4_ = auVar33._28_4_;
          auVar33 = vmaxps_avx(auVar58._0_32_,auVar13);
          pfVar2 = (float *)(uVar19 + 0x100 + uVar26);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar26);
          auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar39._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar39._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar39._28_4_ = auVar41._28_4_ + pfVar1[7];
          auVar13 = vsubps_avx(auVar39,auVar53._0_32_);
          auVar9._4_4_ = auVar56._4_4_ * auVar13._4_4_;
          auVar9._0_4_ = auVar56._0_4_ * auVar13._0_4_;
          auVar9._8_4_ = auVar56._8_4_ * auVar13._8_4_;
          auVar9._12_4_ = auVar56._12_4_ * auVar13._12_4_;
          auVar9._16_4_ = auVar56._16_4_ * auVar13._16_4_;
          auVar9._20_4_ = auVar56._20_4_ * auVar13._20_4_;
          auVar9._24_4_ = auVar56._24_4_ * auVar13._24_4_;
          auVar9._28_4_ = auVar13._28_4_;
          pfVar2 = (float *)(uVar19 + 0x100 + uVar29);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar29);
          auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar44._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar44._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar44._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar44._28_4_ = auVar46._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar44,auVar54._0_32_);
          auVar16._4_4_ = auVar57._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = auVar57._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = auVar57._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = auVar57._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = auVar57._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = auVar57._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = auVar57._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar13 = vmaxps_avx(auVar9,auVar16);
          auVar9 = vmaxps_avx(auVar33,auVar13);
          pfVar2 = (float *)(uVar19 + 0x100 + uVar28);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar28);
          auVar40._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar40._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar40._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar40._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar40._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar40._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar40._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar40._28_4_ = auVar13._28_4_ + pfVar1[7];
          auVar33 = vsubps_avx(auVar40,auVar52._0_32_);
          auVar17._4_4_ = auVar55._4_4_ * auVar33._4_4_;
          auVar17._0_4_ = auVar55._0_4_ * auVar33._0_4_;
          auVar17._8_4_ = auVar55._8_4_ * auVar33._8_4_;
          auVar17._12_4_ = auVar55._12_4_ * auVar33._12_4_;
          auVar17._16_4_ = auVar55._16_4_ * auVar33._16_4_;
          auVar17._20_4_ = auVar55._20_4_ * auVar33._20_4_;
          auVar17._24_4_ = auVar55._24_4_ * auVar33._24_4_;
          auVar17._28_4_ = auVar33._28_4_;
          pfVar2 = (float *)(uVar19 + 0x100 + (uVar26 ^ 0x20));
          auVar33 = vminps_avx(auVar30._0_32_,auVar17);
          pfVar1 = (float *)(uVar19 + 0x40 + (uVar26 ^ 0x20));
          auVar45._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar45._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar45._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar45._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar45._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar45._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar45._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar45._28_4_ = auVar14._28_4_ + pfVar1[7];
          auVar13 = vsubps_avx(auVar45,auVar53._0_32_);
          pfVar2 = (float *)(uVar19 + 0x100 + (uVar29 ^ 0x20));
          pfVar1 = (float *)(uVar19 + 0x40 + (uVar29 ^ 0x20));
          auVar49._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar49._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar49._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar49._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar49._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar49._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar49._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar49._28_4_ = auVar50._28_4_ + pfVar1[7];
          auVar14._4_4_ = auVar56._4_4_ * auVar13._4_4_;
          auVar14._0_4_ = auVar56._0_4_ * auVar13._0_4_;
          auVar14._8_4_ = auVar56._8_4_ * auVar13._8_4_;
          auVar14._12_4_ = auVar56._12_4_ * auVar13._12_4_;
          auVar14._16_4_ = auVar56._16_4_ * auVar13._16_4_;
          auVar14._20_4_ = auVar56._20_4_ * auVar13._20_4_;
          auVar14._24_4_ = auVar56._24_4_ * auVar13._24_4_;
          auVar14._28_4_ = auVar13._28_4_;
          auVar13 = vsubps_avx(auVar49,auVar54._0_32_);
          auVar18._4_4_ = auVar57._4_4_ * auVar13._4_4_;
          auVar18._0_4_ = auVar57._0_4_ * auVar13._0_4_;
          auVar18._8_4_ = auVar57._8_4_ * auVar13._8_4_;
          auVar18._12_4_ = auVar57._12_4_ * auVar13._12_4_;
          auVar18._16_4_ = auVar57._16_4_ * auVar13._16_4_;
          auVar18._20_4_ = auVar57._20_4_ * auVar13._20_4_;
          auVar18._24_4_ = auVar57._24_4_ * auVar13._24_4_;
          auVar18._28_4_ = auVar13._28_4_;
          auVar50 = ZEXT3264(auVar18);
          auVar13 = vminps_avx(auVar14,auVar18);
          auVar33 = vminps_avx(auVar33,auVar13);
          auVar33 = vcmpps_avx(auVar9,auVar33,2);
          if (((uint)uVar25 & 7) == 6) {
            auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar36,2);
            auVar14 = vcmpps_avx(auVar36,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
            auVar14 = vandps_avx(auVar13,auVar14);
            auVar33 = vandps_avx(auVar14,auVar33);
            auVar37 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
          }
          else {
            auVar37 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
          }
          auVar46 = ZEXT3264(auVar13);
          auVar37 = vpsllw_avx(auVar37,0xf);
          auVar41 = ZEXT1664(auVar37);
          local_24e0.valid = (int *)auVar9._0_8_;
          local_24e0.geometryUserPtr = (void *)auVar9._8_8_;
          local_24e0.primID = auVar9._16_4_;
          local_24e0._20_4_ = auVar9._20_4_;
          local_24e0.context = (RTCRayQueryContext *)auVar9._24_8_;
          if ((((((((auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar37[0xf]) {
            auVar37 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar34 = ZEXT1664(auVar37);
            goto LAB_00e7a06e;
          }
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          auVar34 = ZEXT1664(auVar37);
          bVar15 = SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar37 >> 0x17,0) & 1) << 2 | (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar37 >> 0x27,0) & 1) << 4 | (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar37 >> 0x37,0) & 1) << 6 | SUB161(auVar37 >> 0x3f,0) << 7;
          lVar20 = 0;
          if (bVar15 != 0) {
            for (; (bVar15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar25 = *(ulong *)(uVar19 + lVar20 * 8);
          uVar24 = bVar15 - 1 & (uint)bVar15;
          if (uVar24 != 0) {
            uVar6 = *(uint *)((long)&local_24e0.valid + lVar20 * 4);
            lVar20 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar19 + lVar20 * 8);
            uVar7 = *(uint *)((long)&local_24e0.valid + lVar20 * 4);
            uVar24 = uVar24 - 1 & uVar24;
            if (uVar24 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*local_2520 = uVar8;
                *(uint *)(*local_2520 + 8) = uVar7;
                local_2520 = local_2520 + 1;
              }
              else {
                *(ulong *)*local_2520 = uVar25;
                *(uint *)(*local_2520 + 8) = uVar6;
                local_2520 = local_2520 + 1;
                uVar25 = uVar8;
              }
            }
            else {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar25;
              auVar37 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar6));
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar8;
              auVar31 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar7));
              lVar20 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(uVar19 + lVar20 * 8);
              auVar47 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                 lVar20 * 4)));
              auVar41 = ZEXT1664(auVar47);
              auVar35 = vpcmpgtd_avx(auVar31,auVar37);
              auVar46 = ZEXT1664(auVar35);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar42 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar31,auVar37,auVar42);
                auVar37 = vblendvps_avx(auVar37,auVar31,auVar42);
                auVar31 = vpcmpgtd_avx(auVar47,auVar35);
                auVar42 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar47,auVar35,auVar42);
                auVar46 = ZEXT1664(auVar31);
                auVar35 = vblendvps_avx(auVar35,auVar47,auVar42);
                auVar47 = vpcmpgtd_avx(auVar35,auVar37);
                auVar42 = vpshufd_avx(auVar47,0xaa);
                auVar41 = ZEXT1664(auVar42);
                auVar47 = vblendvps_avx(auVar35,auVar37,auVar42);
                auVar50 = ZEXT1664(auVar47);
                auVar37 = vblendvps_avx(auVar37,auVar35,auVar42);
                auVar34 = ZEXT1664(auVar37);
                *local_2520 = auVar37;
                local_2520[1] = auVar47;
                uVar25 = auVar31._0_8_;
                local_2520 = local_2520 + 2;
              }
              else {
                lVar20 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *(ulong *)(uVar19 + lVar20 * 8);
                auVar42 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                   lVar20 * 4)));
                auVar50 = ZEXT1664(auVar42);
                uVar24 = uVar24 - 1 & uVar24;
                uVar25 = (ulong)uVar24;
                if (uVar24 == 0) {
                  auVar43 = vpshufd_avx(auVar35,0xaa);
                  auVar35 = vblendvps_avx(auVar31,auVar37,auVar43);
                  auVar37 = vblendvps_avx(auVar37,auVar31,auVar43);
                  auVar31 = vpcmpgtd_avx(auVar42,auVar47);
                  auVar43 = vpshufd_avx(auVar31,0xaa);
                  auVar31 = vblendvps_avx(auVar42,auVar47,auVar43);
                  auVar47 = vblendvps_avx(auVar47,auVar42,auVar43);
                  auVar42 = vpcmpgtd_avx(auVar47,auVar37);
                  auVar43 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar47,auVar37,auVar43);
                  auVar50 = ZEXT1664(auVar42);
                  auVar37 = vblendvps_avx(auVar37,auVar47,auVar43);
                  auVar34 = ZEXT1664(auVar37);
                  auVar47 = vpcmpgtd_avx(auVar31,auVar35);
                  auVar43 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar31,auVar35,auVar43);
                  auVar41 = ZEXT1664(auVar47);
                  auVar31 = vblendvps_avx(auVar35,auVar31,auVar43);
                  auVar35 = vpcmpgtd_avx(auVar42,auVar31);
                  auVar43 = vpshufd_avx(auVar35,0xaa);
                  auVar46 = ZEXT1664(auVar43);
                  auVar35 = vblendvps_avx(auVar42,auVar31,auVar43);
                  auVar31 = vblendvps_avx(auVar31,auVar42,auVar43);
                  *local_2520 = auVar37;
                  local_2520[1] = auVar31;
                  local_2520[2] = auVar35;
                  uVar25 = auVar47._0_8_;
                  local_2520 = local_2520 + 3;
                }
                else {
                  *local_2520 = auVar37;
                  local_2520[1] = auVar31;
                  local_2520[2] = auVar47;
                  pauVar21 = local_2520 + 3;
                  local_2520[3] = auVar42;
                  do {
                    lVar20 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                      }
                    }
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = *(ulong *)(uVar19 + lVar20 * 8);
                    auVar37 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                       lVar20 * 4)));
                    pauVar21[1] = auVar37;
                    pauVar21 = pauVar21 + 1;
                    uVar25 = uVar25 & uVar25 - 1;
                  } while (uVar25 != 0);
                  lVar20 = 0;
                  while (auVar34 = ZEXT1664(auVar37), pauVar21 != local_2520) {
                    auVar37 = local_2520[1];
                    uVar24 = vextractps_avx(auVar37,2);
                    for (lVar23 = 0x10;
                        (lVar20 != lVar23 && (*(uint *)(local_2520[-1] + lVar23 + 8) < uVar24));
                        lVar23 = lVar23 + -0x10) {
                      *(undefined1 (*) [16])(*local_2520 + lVar23) =
                           *(undefined1 (*) [16])(local_2520[-1] + lVar23);
                    }
                    *(undefined1 (*) [16])(*local_2520 + lVar23) = auVar37;
                    lVar20 = lVar20 + -0x10;
                    local_2520 = local_2520 + 1;
                  }
                  uVar25 = *(ulong *)*pauVar21;
                  local_2520 = pauVar21;
                }
              }
            }
          }
        }
        local_24f0 = (ulong)((uint)uVar25 & 0xf) - 8;
        for (local_24e8 = 0; local_24f0 != local_24e8; local_24e8 = local_24e8 + 1) {
          local_24e0.geomID = *(uint *)((uVar25 & 0xfffffffffffffff0) + local_24e8 * 8);
          local_24b0 = (context->scene->geometries).items[local_24e0.geomID].ptr;
          if (((ray->super_RayK<1>).mask & local_24b0->mask) != 0) {
            local_250c = 0xffffffff;
            local_24e0.geometryUserPtr = local_24b0->userPtr;
            local_24e0.valid = &local_250c;
            auVar37 = (undefined1  [16])local_24e0._0_16_;
            local_24e0.context = context->user;
            local_24e0.N = 1;
            local_24e0.primID = *(undefined4 *)((uVar25 & 0xfffffffffffffff0) + 4 + local_24e8 * 8);
            local_24e0._0_20_ = CONCAT416(local_24e0.primID,auVar37);
            local_24a8 = 0;
            local_24a0 = context->args;
            pp_Var22 = (_func_int **)local_24a0->intersect;
            if (pp_Var22 == (_func_int **)0x0) {
              pp_Var22 = local_24b0[1].super_RefCount._vptr_RefCount;
            }
            auVar41 = ZEXT1664(auVar41._0_16_);
            auVar46 = ZEXT1664(auVar46._0_16_);
            auVar50 = ZEXT1664(auVar50._0_16_);
            local_24e0.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var22)(&local_24e0);
            auVar52 = ZEXT3264(local_23c0);
            auVar53 = ZEXT3264(local_23e0);
            auVar54 = ZEXT3264(local_2400);
            auVar55 = ZEXT3264(local_2420);
            auVar56 = ZEXT3264(local_2440);
            auVar57 = ZEXT3264(local_2460);
            auVar58 = ZEXT3264(local_2480);
            context = local_24f8;
            ray = local_2500;
            uVar27 = local_2508;
          }
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar30 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar34 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00e7a06e;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }